

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlParseContent(htmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlChar *str1;
  xmlChar *newtag;
  bool bVar3;
  xmlChar *name;
  int depth;
  xmlChar *currentNode;
  htmlParserCtxtPtr ctxt_local;
  
  str1 = xmlStrdup(ctxt->name);
  iVar1 = ctxt->nameNr;
LAB_0015c08d:
  do {
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    if (ctxt->instate == XML_PARSER_EOF) {
LAB_0015c5c6:
      if (str1 == (xmlChar *)0x0) {
        return;
      }
      (*xmlFree)(str1);
      return;
    }
    if ((*ctxt->input->cur != '<') || (ctxt->input->cur[1] != '/')) {
      if ((*ctxt->input->cur == '<') &&
         ((((0x40 < ctxt->input->cur[1] && (ctxt->input->cur[1] < 0x5b)) ||
           ((0x60 < ctxt->input->cur[1] && (ctxt->input->cur[1] < 0x7b)))) ||
          ((ctxt->input->cur[1] == '_' || (ctxt->input->cur[1] == ':')))))) {
        newtag = htmlParseHTMLName_nonInvasive(ctxt);
        if (newtag == (xmlChar *)0x0) {
          htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseStartTag: invalid element name\n",
                       (xmlChar *)0x0,(xmlChar *)0x0);
          while( true ) {
            bVar3 = false;
            if (*ctxt->input->cur != '\0') {
              bVar3 = *ctxt->input->cur != '>';
            }
            if (!bVar3) break;
            xmlNextChar(ctxt);
          }
          if (str1 == (xmlChar *)0x0) {
            return;
          }
          (*xmlFree)(str1);
          return;
        }
        if ((ctxt->name != (xmlChar *)0x0) &&
           (iVar2 = htmlCheckAutoClose(newtag,ctxt->name), iVar2 == 1)) {
          htmlAutoClose(ctxt,newtag);
          goto LAB_0015c08d;
        }
      }
      if (((0 < ctxt->nameNr) && (ctxt->nameNr <= iVar1)) &&
         (iVar2 = xmlStrEqual(str1,ctxt->name), iVar2 == 0)) {
        if (str1 == (xmlChar *)0x0) {
          return;
        }
        (*xmlFree)(str1);
        return;
      }
      if ((*ctxt->input->cur == '\0') ||
         ((iVar2 = xmlStrEqual(str1,"script"), iVar2 == 0 &&
          (iVar2 = xmlStrEqual(str1,"style"), iVar2 == 0)))) {
        if ((*ctxt->input->cur == '<') &&
           (((ctxt->input->cur[1] == '!' &&
             (iVar2 = toupper((uint)ctxt->input->cur[2]), iVar2 == 0x44)) &&
            ((iVar2 = toupper((uint)ctxt->input->cur[3]), iVar2 == 0x4f &&
             ((((iVar2 = toupper((uint)ctxt->input->cur[4]), iVar2 == 0x43 &&
                (iVar2 = toupper((uint)ctxt->input->cur[5]), iVar2 == 0x54)) &&
               (iVar2 = toupper((uint)ctxt->input->cur[6]), iVar2 == 0x59)) &&
              ((iVar2 = toupper((uint)ctxt->input->cur[7]), iVar2 == 0x50 &&
               (iVar2 = toupper((uint)ctxt->input->cur[8]), iVar2 == 0x45)))))))))) {
          htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"Misplaced DOCTYPE declaration\n",
                       (xmlChar *)"DOCTYPE",(xmlChar *)0x0);
          htmlParseDocTypeDecl(ctxt);
        }
        if (((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) &&
           ((ctxt->input->cur[2] == '-' && (ctxt->input->cur[3] == '-')))) {
          htmlParseComment(ctxt);
        }
        else if ((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '?')) {
          htmlParsePI(ctxt);
        }
        else if (*ctxt->input->cur == '<') {
          htmlParseElement(ctxt);
        }
        else if (*ctxt->input->cur == '&') {
          htmlParseReference(ctxt);
        }
        else {
          if (*ctxt->input->cur == '\0') {
            htmlAutoCloseOnEnd(ctxt);
            goto LAB_0015c5c6;
          }
          htmlParseCharData(ctxt);
        }
      }
      else {
        htmlParseScript(ctxt);
      }
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlParserInputGrow(ctxt->input,0xfa);
      }
      goto LAB_0015c08d;
    }
    iVar2 = htmlParseEndTag(ctxt);
    if ((iVar2 != 0) && ((str1 != (xmlChar *)0x0 || (ctxt->nameNr == 0)))) {
      if (str1 != (xmlChar *)0x0) {
        (*xmlFree)(str1);
      }
      return;
    }
  } while( true );
}

Assistant:

static void
htmlParseContent(htmlParserCtxtPtr ctxt) {
    xmlChar *currentNode;
    int depth;
    const xmlChar *name;

    currentNode = xmlStrdup(ctxt->name);
    depth = ctxt->nameNr;
    while (1) {
        GROW;

        if (ctxt->instate == XML_PARSER_EOF)
            break;

	/*
	 * Our tag or one of it's parent or children is ending.
	 */
        if ((CUR == '<') && (NXT(1) == '/')) {
	    if (htmlParseEndTag(ctxt) &&
		((currentNode != NULL) || (ctxt->nameNr == 0))) {
		if (currentNode != NULL)
		    xmlFree(currentNode);
		return;
	    }
	    continue; /* while */
        }

	else if ((CUR == '<') &&
	         ((IS_ASCII_LETTER(NXT(1))) ||
		  (NXT(1) == '_') || (NXT(1) == ':'))) {
	    name = htmlParseHTMLName_nonInvasive(ctxt);
	    if (name == NULL) {
	        htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
			 "htmlParseStartTag: invalid element name\n",
			 NULL, NULL);
	        /* Dump the bogus tag like browsers do */
                while ((CUR != 0) && (CUR != '>'))
	            NEXT;

	        if (currentNode != NULL)
	            xmlFree(currentNode);
	        return;
	    }

	    if (ctxt->name != NULL) {
	        if (htmlCheckAutoClose(name, ctxt->name) == 1) {
	            htmlAutoClose(ctxt, name);
	            continue;
	        }
	    }
	}

	/*
	 * Has this node been popped out during parsing of
	 * the next element
	 */
        if ((ctxt->nameNr > 0) && (depth >= ctxt->nameNr) &&
	    (!xmlStrEqual(currentNode, ctxt->name)))
	     {
	    if (currentNode != NULL) xmlFree(currentNode);
	    return;
	}

	if ((CUR != 0) && ((xmlStrEqual(currentNode, BAD_CAST"script")) ||
	    (xmlStrEqual(currentNode, BAD_CAST"style")))) {
	    /*
	     * Handle SCRIPT/STYLE separately
	     */
	    htmlParseScript(ctxt);
	} else {
	    /*
	     * Sometimes DOCTYPE arrives in the middle of the document
	     */
	    if ((CUR == '<') && (NXT(1) == '!') &&
		(UPP(2) == 'D') && (UPP(3) == 'O') &&
		(UPP(4) == 'C') && (UPP(5) == 'T') &&
		(UPP(6) == 'Y') && (UPP(7) == 'P') &&
		(UPP(8) == 'E')) {
		htmlParseErr(ctxt, XML_HTML_STRUCURE_ERROR,
		             "Misplaced DOCTYPE declaration\n",
			     BAD_CAST "DOCTYPE" , NULL);
		htmlParseDocTypeDecl(ctxt);
	    }

	    /*
	     * First case :  a comment
	     */
	    if ((CUR == '<') && (NXT(1) == '!') &&
		(NXT(2) == '-') && (NXT(3) == '-')) {
		htmlParseComment(ctxt);
	    }

	    /*
	     * Second case : a Processing Instruction.
	     */
	    else if ((CUR == '<') && (NXT(1) == '?')) {
		htmlParsePI(ctxt);
	    }

	    /*
	     * Third case :  a sub-element.
	     */
	    else if (CUR == '<') {
		htmlParseElement(ctxt);
	    }

	    /*
	     * Fourth case : a reference. If if has not been resolved,
	     *    parsing returns it's Name, create the node
	     */
	    else if (CUR == '&') {
		htmlParseReference(ctxt);
	    }

	    /*
	     * Fifth case : end of the resource
	     */
	    else if (CUR == 0) {
		htmlAutoCloseOnEnd(ctxt);
		break;
	    }

	    /*
	     * Last case, text. Note that References are handled directly.
	     */
	    else {
		htmlParseCharData(ctxt);
	    }
	}
        GROW;
    }
    if (currentNode != NULL) xmlFree(currentNode);
}